

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformations_t *
opengv::absolute_pose::upnp
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  pointer pMVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int i;
  long lVar8;
  Scalar SVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  double gamma;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Matrix<double,_3,_1,_0,_3,_1> bi;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions1;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions2;
  Matrix<double,_3,_1,_0,_3,_1> v_1;
  Matrix<double,_3,_1,_0,_3,_1> J;
  Matrix<double,_3,_1,_0,_3,_1> v_3;
  vector<double,_std::allocator<double>_> characteristicPolynomial;
  Matrix<double,_3,_1,_0,_3,_1> p_4;
  Vector3d p_est;
  Matrix<double,_3,_1,_0,_3,_1> v;
  Matrix<double,_1,_10,_1,_1,_10> C_cay;
  vector<double,_std::allocator<double>_> roots;
  Matrix<double,_3,_1,_0,_3,_1> p_1;
  Matrix<double,_1,_10,_1,_1,_10> C;
  translation_t tinv_1;
  Matrix<double,_3,_1,_0,_3,_1> bi_1;
  Vector3d cay;
  Matrix<double,_3,_3,_0,_3,_3> H;
  Matrix<double,_3,_3,_0,_3,_3> F;
  Matrix<double,_10,_10,_0,_10,_10> M_cay;
  Matrix<double,_3,_10,_0,_3,_10> I_cay;
  Matrix<double,_3,_10,_0,_3,_10> Phi;
  Matrix<double,_3,_10,_0,_3,_10> I;
  Matrix<double,_10,_10,_0,_10,_10> M;
  Matrix<double,_3,_3,_0,_3,_3> H_inv;
  Matrix3d local_ed8;
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_e90;
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_e70;
  undefined1 local_e50 [16];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_e40;
  variable_if_dynamic<long,__1> local_e38;
  variable_if_dynamic<long,__1> local_e30;
  Index local_e28;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_df8 [24];
  undefined1 local_de0 [16];
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPStack_dd0;
  variable_if_dynamic<long,__1> vStack_dc8;
  variable_if_dynamic<long,__1> vStack_dc0;
  Index local_db8;
  Matrix<double,_3,_1,_0,_3,_1> *local_da8;
  ulong local_d90;
  undefined8 uStack_d88;
  long local_d78;
  _Vector_base<double,_std::allocator<double>_> local_d70;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> local_d58;
  undefined1 local_d28 [16];
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_d18;
  variable_if_dynamic<long,__1> local_d10;
  variable_if_dynamic<long,__1> local_d08;
  Index local_d00;
  undefined1 local_ce0 [72];
  double local_c98 [23];
  Matrix<double,_1,_10,_1,_1,_10> local_be0;
  undefined1 local_b90 [16];
  double local_b80;
  _Vector_base<double,_std::allocator<double>_> local_b70;
  Matrix<double,_3,_3,_0,_3,_3> local_b58;
  Matrix<double,_1,_10,_1,_1,_10> local_b10;
  Matrix<double,_3,_1,_0,_3,_1> local_ab8;
  quaternion_t local_aa0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a68 [24];
  Matrix<double,_3,_3,_0,_3,_3> local_a50;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_a08 [72];
  undefined1 local_9c0 [320];
  undefined1 local_880 [16];
  double local_830;
  double local_7e0;
  Matrix<double,_3,_10,_0,_3,_10> local_690;
  Matrix<double,_3,_10,_0,_3,_10> local_5a0;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_4b0 [3];
  Matrix<double,_10,_10,_0,_10,_10> local_3c0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_a0 [112];
  
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (local_a08,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_3c0);
  for (lVar8 = 0; lVar8 < (int)indices->_numberCorrespondences; lVar8 = lVar8 + 1) {
    iVar7 = (int)lVar8;
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[5])(&local_3c0,adapter,(long)iVar4);
    if (indices->_useIndices != false) {
      iVar7 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[2])(local_4b0,adapter,(long)iVar7);
    local_5a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.array
    [0] = (double)&local_3c0;
    local_5a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.array
    [1] = (double)local_4b0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_9c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_5a0);
    local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
    array[0] = (double)local_9c0;
    local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
    array[1] = (double)local_9c0;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_a08,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&local_3c0);
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,indices->_numberCorrespondences);
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [5] = (double)local_a08;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [3] = auVar2._0_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            (local_a0,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       *)&local_3c0);
  Eigen::internal::
  compute_inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
  run((Matrix<double,_3,_3,_0,_3,_3> *)local_a0,&local_a50);
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,10,0,3,10>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_4b0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
              *)&local_3c0);
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_df8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_3c0);
  for (lVar8 = 0; lVar8 < (int)indices->_numberCorrespondences; lVar8 = lVar8 + 1) {
    iVar7 = (int)lVar8;
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[5])(&local_3c0,adapter,(long)iVar4);
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[2])
              ((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)local_9c0,adapter,(long)iVar4);
    local_ce0._0_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_3c0;
    local_ce0._8_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)local_9c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_690,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)local_ce0);
    local_9c0._0_8_ = &local_a50;
    local_9c0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_690;
    local_9c0._16_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_690;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_3c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_0>_>
                *)local_9c0);
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[6])(local_9c0,adapter,(long)iVar4);
    if (indices->_useIndices != false) {
      iVar7 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[4])(local_ce0,adapter,(long)iVar7);
    fill3x10((Vector3d *)local_9c0,&local_5a0);
    local_b10.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = (double)&local_3c0;
    local_b10.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = (double)&local_5a0;
    Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_4b0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)&local_b10);
    local_b10.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = (double)&local_3c0;
    local_b10.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = (double)local_ce0;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_df8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_b10);
  }
  local_9c0._8_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,10,0,10,10>>>
            ((PlainObjectBase<Eigen::Matrix<double,10,10,0,10,10>> *)&local_3c0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>
              *)local_9c0);
  local_9c0._8_8_ =
       (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
        *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,10,1,1,10>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>>>
            ((PlainObjectBase<Eigen::Matrix<double,1,10,1,1,10>> *)&local_b10,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
              *)local_9c0);
  auVar18 = ZEXT864(0) << 0x40;
  lVar8 = 0;
  while( true ) {
    gamma = auVar18._0_8_;
    if ((int)indices->_numberCorrespondences <= lVar8) break;
    iVar7 = (int)lVar8;
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[5])(local_9c0,adapter,(long)iVar4);
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_690,adapter,(long)iVar4);
    local_ce0._0_8_ = local_9c0;
    local_ce0._8_8_ = &local_690;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_be0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)local_ce0);
    iVar4 = iVar7;
    if (indices->_useIndices != false) {
      iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[4])(local_e50,adapter,(long)iVar4);
    if (indices->_useIndices != false) {
      iVar7 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
    }
    (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_b58,adapter,(long)iVar7);
    fill3x10((Vector3d *)&local_b58,&local_5a0);
    local_9c0._0_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_be0;
    local_9c0._8_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_be0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_690,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)local_9c0);
    local_ce0._16_8_ = local_4b0;
    local_ce0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_690;
    local_ce0._8_8_ = &local_5a0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,10,0,3,10>const,Eigen::Matrix<double,3,10,0,3,10>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_9c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_0>_>
                *)local_ce0);
    local_ce0._16_8_ = local_e50;
    local_ce0._24_8_ = local_df8;
    local_ce0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_690;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_ed8,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)local_ce0);
    local_ce0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_9c0;
    local_ce0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_9c0;
    Eigen::MatrixBase<Eigen::Matrix<double,10,10,0,10,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,10,10,0,10,10>> *)&local_3c0,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)local_ce0);
    local_ce0._0_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_ed8;
    local_ce0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_9c0;
    Eigen::MatrixBase<Eigen::Matrix<double,1,10,1,1,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,10,1,1,10>> *)&local_b10,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)local_ce0);
    local_ce0._0_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_ed8;
    local_ce0._8_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_ed8;
    SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)local_ce0);
    lVar8 = lVar8 + 1;
    auVar18 = ZEXT864((ulong)(gamma + SVar9));
  }
  local_e90._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e90._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e90._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (indices->_numberCorrespondences < 5) {
    modules::upnp_main(&local_3c0,&local_b10,gamma,
                       (vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                        *)&local_e90);
  }
  else {
    modules::upnp_main_sym
              (&local_3c0,&local_b10,gamma,
               (vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *)&local_e90);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0;
  while (uVar6 < (ulong)((long)local_e90._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_e90._M_impl.super__Vector_impl_data._M_start >> 6)) {
    local_d90 = uVar6;
    math::quaternion2rot(&local_e90._M_impl.super__Vector_impl_data._M_start[uVar6].second);
    local_d78 = uVar6 * 0x40;
    modules::upnp_fill_s
              (&local_e90._M_impl.super__Vector_impl_data._M_start[uVar6].second,
               (Matrix<double,_10,_1,_0,_10,_1> *)&local_690);
    local_9c0._0_8_ = local_4b0;
    local_9c0._16_8_ = local_df8;
    local_9c0._8_8_ =
         (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
          *)&local_690;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_b58,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_9c0);
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_e50._0_8_ = local_ce0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = 0.0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[4] = 0.0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[5] = 1.48219693752374e-323;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = (double)local_9c0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (double)local_9c0;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&local_be0,
                 (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e50);
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = 0.0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[4] = 0.0;
      local_e50._0_8_ = local_9c0 + 0x48;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[7] = (double)&local_b58;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[5] = 1.48219693752374e-323;
      local_e38.m_value = 0;
      local_e30.m_value = 3;
      local_e28 = 3;
      local_e40 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_9c0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = (double)local_9c0;
      local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (double)local_9c0;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)local_e50,
                 (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                  *)&local_be0);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_9c0);
    }
    lVar8 = 0;
    iVar7 = 0;
    while( true ) {
      if ((int)indices->_numberCorrespondences <= lVar8) break;
      iVar4 = (int)lVar8;
      iVar5 = iVar4;
      if (indices->_useIndices != false) {
        iVar5 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_9c0,adapter,(long)iVar5);
      iVar5 = iVar4;
      if (indices->_useIndices != false) {
        iVar5 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_e50,adapter,(long)iVar5);
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_9c0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)local_e50;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_be0,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)&local_ed8);
      iVar5 = iVar4;
      if (indices->_useIndices != false) {
        iVar5 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(local_e50,adapter,(long)iVar5);
      if (indices->_useIndices != false) {
        iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_ed8,adapter,(long)iVar4);
      local_9c0._8_8_ = local_ce0;
      local_9c0._16_8_ = local_e50;
      local_9c0._24_8_ = &local_b58;
      local_9c0._40_8_ = &local_ed8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d28,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_9c0);
      local_9c0._0_8_ =
           (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
            *)local_d28;
      local_9c0._8_8_ =
           (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
            *)&local_be0;
      SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)local_9c0);
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + (uint)(SVar9 < 0.0);
    }
    auVar2 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,indices->_numberCorrespondences);
    auVar2 = vfmadd132sd_fma(auVar2,ZEXT816(0x3fe0000000000000),ZEXT816(0x3fc999999999999a));
    auVar2 = vroundsd_avx(auVar2,auVar2,9);
    if ((double)iVar7 < auVar2._0_8_) {
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::push_back((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   *)&local_e70,
                  (value_type *)
                  ((long)&((pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                          (&(local_e90._M_impl.super__Vector_impl_data._M_start)->second + -1))->
                          first + local_d78));
    }
    uVar6 = local_d90 + 1;
  }
  if (local_e70._M_impl.super__Vector_impl_data._M_finish !=
      local_e70._M_impl.super__Vector_impl_data._M_start) {
    pMVar1 = (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pMVar1) {
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pMVar1;
    }
    local_d90 = 0x4000000000000000;
    uStack_d88 = 0x4000000000000000;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)local_e70._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e70._M_impl.super__Vector_impl_data._M_start >> 6);
        uVar6 = uVar6 + 1) {
      local_ce0._8_8_ = 0.0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,10,0,3,10>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,10,0,3,10>>>
                (&local_690,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>
                  *)local_ce0);
      math::quaternion2rot(&local_e70._M_impl.super__Vector_impl_data._M_start[uVar6].second);
      for (lVar8 = 0; lVar8 < (int)indices->_numberCorrespondences; lVar8 = lVar8 + 1) {
        iVar7 = (int)lVar8;
        iVar4 = iVar7;
        if (indices->_useIndices != false) {
          iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[5])
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0,adapter,(long)iVar4
                  );
        iVar4 = iVar7;
        if (indices->_useIndices != false) {
          iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[2])
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_e50,adapter,(long)iVar4
                  );
        local_d28._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
        local_d28._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_e50;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_ed8,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_d28);
        local_e50._0_8_ = &local_a50;
        local_e50._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_ed8;
        local_e40 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_ed8;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_0>_>
                    *)local_e50);
        if (indices->_useIndices != false) {
          iVar7 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[6])
                  ((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)local_d28,adapter,(long)iVar7);
        local_de0._0_8_ = &local_b58;
        local_de0._8_8_ =
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
              *)local_d28;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_e50,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_de0);
        fill3x10((Vector3d *)local_e50,&local_5a0);
        local_d28._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
        local_d28._8_8_ = &local_5a0;
        Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,3,10,0,3,10>> *)&local_690,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)local_d28);
      }
      local_ce0._8_8_ = 0.0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,10,10,0,10,10>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,10,0,10,10>>>
                ((Matrix<double,_10,_10,_0,_10,_10> *)local_9c0,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>_>
                  *)local_ce0);
      local_ce0._8_8_ =
           (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
            *)0x0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,1,10,1,1,10>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>>>
                (&local_be0,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>
                  *)local_ce0);
      for (lVar8 = 0; lVar8 < (int)indices->_numberCorrespondences; lVar8 = lVar8 + 1) {
        iVar7 = (int)lVar8;
        iVar4 = iVar7;
        if (indices->_useIndices != false) {
          iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[5])
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0,adapter,(long)iVar4
                  );
        iVar4 = iVar7;
        if (indices->_useIndices != false) {
          iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[2])(local_e50,adapter,(long)iVar4);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_ce0;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_e50;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d28,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)&local_ed8);
        iVar4 = iVar7;
        if (indices->_useIndices != false) {
          iVar4 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[4])(local_de0,adapter,(long)iVar4);
        if (indices->_useIndices != false) {
          iVar7 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[6])
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0,adapter,(long)iVar7
                  );
        local_e50._0_8_ = &local_b58;
        local_e50._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d58,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_e50);
        fill3x10((Vector3d *)&local_d58,&local_5a0);
        local_ce0._0_8_ = local_d28;
        local_ce0._8_8_ = local_ce0._0_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_e50,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)local_ce0);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = (double)&local_690;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_e50;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)&local_5a0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,10,0,3,10>const,Eigen::Matrix<double,3,10,0,3,10>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,10,0,3,10>> *)local_ce0,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_0>_>
                    *)&local_ed8);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = (double)local_de0;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = (double)local_df8;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_e50;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_aa0,
                   (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                    *)&local_ed8);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_ce0;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_ce0;
        Eigen::MatrixBase<Eigen::Matrix<double,10,10,0,10,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,10,10,0,10,10>> *)local_9c0,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)&local_ed8);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)&local_aa0;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_ce0;
        Eigen::MatrixBase<Eigen::Matrix<double,1,10,1,1,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,1,10,1,1,10>> *)&local_be0,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)&local_ed8);
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)&local_aa0;
        local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)&local_aa0;
        Eigen::internal::dense_product_base::operator_cast_to_double
                  ((dense_product_base *)&local_ed8);
      }
      auVar2 = vmovhpd_avx(local_880,local_830);
      auVar15._0_8_ =
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[4] +
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[4];
      auVar15._8_8_ =
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[5] +
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[5];
      auVar3._8_8_ = uStack_d88;
      auVar3._0_8_ = local_d90;
      local_b90 = vfmadd132pd_fma(auVar2,auVar15,auVar3);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_7e0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[6] +
           local_be0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[6];
      auVar2 = vfmadd231sd_fma(auVar10,ZEXT816(0x4000000000000000),auVar2);
      local_b80 = auVar2._0_8_;
      Jac((Matrix<double,_10,_10,_0,_10,_10> *)local_9c0,&local_be0,local_b80,&local_ed8);
      local_d70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_ce0._0_8_ = -1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_d70,(double *)local_ce0);
      local_ce0._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] +
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_d70,(double *)local_ce0);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar2 = vfnmsub231sd_fma(auVar23,auVar16,auVar11);
      auVar3 = vfnmadd231sd_fma(auVar2,auVar16,auVar19);
      auVar12._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar12._8_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar2 = vshufpd_avx(auVar12,auVar12,1);
      local_ce0._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] + auVar12._0_8_ + auVar2._0_8_ + auVar3._0_8_;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_d70,(double *)local_ce0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           (local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] +
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7]) *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar2 = vfmadd231sd_fma(auVar24,auVar25,auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar2 = vfnmadd213sd_fma(auVar21,auVar13,auVar2);
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar2 = vfnmadd213sd_fma(auVar14,auVar25,auVar2);
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] *
           local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar2 = vfnmadd213sd_fma(auVar22,auVar17,auVar2);
      local_ce0._0_8_ = auVar2._0_8_;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_d70,(double *)local_ce0);
      math::o3_roots((vector<double,_std::allocator<double>_> *)&local_b70,
                     (vector<double,_std::allocator<double>_> *)&local_d70);
      local_ce0._0_8_ = &local_ed8;
      local_ce0._16_8_ = local_b90;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                (local_a68,
                 (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)local_ce0);
      math::cayley2rot((rotation_t *)local_ce0,(cayley_t *)local_a68);
      local_e50._8_8_ = &local_b58;
      local_e50._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_d28,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)local_e50);
      math::rot2quaternion(&local_aa0,(rotation_t *)local_d28);
      modules::upnp_fill_s(&local_aa0,(Matrix<double,_10,_1,_0,_10,_1> *)local_e50);
      local_ce0._0_8_ = local_4b0;
      local_ce0._16_8_ = local_df8;
      local_ce0._8_8_ =
           (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
            *)local_e50;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_ab8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_ce0);
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false>,_0>.m_data =
           (PointerType)local_d28;
      vStack_dc8.m_value = 0;
      vStack_dc0.m_value = 0;
      local_db8 = 3;
      local_de0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
      pPStack_dd0 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)local_de0,
                 (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_d58);
      vStack_dc8.m_value = 0;
      vStack_dc0.m_value = 0;
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false>,_0>.m_data =
           local_c98;
      local_da8 = &local_ab8;
      local_db8 = 3;
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.m_startRow.
      m_value = 0;
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.m_startCol.
      m_value = 3;
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.m_outerStride =
           3;
      local_de0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
      pPStack_dd0 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_ce0;
      local_d58.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false,_true>.m_xpr =
           (XprTypeNested)local_ce0;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                (&local_d58,
                 (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                  *)local_de0);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_ce0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b70);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d70);
    }
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_de0._0_8_ =
           ((local_e70._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
      local_de0._8_8_ =
           ((local_e70._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
      pPStack_dd0 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                    ((local_e70._M_impl.super__Vector_impl_data._M_start)->second).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[2];
      vStack_dc8.m_value =
           (long)((local_e70._M_impl.super__Vector_impl_data._M_start)->second).
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3];
      modules::upnp_fill_s((Vector4d *)local_de0,(Matrix<double,_10,_1,_0,_10,_1> *)local_e50);
      local_ce0._0_8_ = local_4b0;
      local_ce0._16_8_ = local_df8;
      local_ce0._8_8_ =
           (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
            *)local_e50;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d58,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_ce0);
      math::quaternion2rot((quaternion_t *)local_de0);
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 0.0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 1.48219693752374e-323;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_ce0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = (double)local_ce0;
      local_d28._0_8_ = &local_b58;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&local_ed8,
                 (Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d28);
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 0.0;
      local_d28._0_8_ = local_c98;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 1.48219693752374e-323;
      local_d10.m_value = 0;
      local_d08.m_value = 3;
      local_d00 = 3;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_ce0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = (double)local_ce0;
      local_ed8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = (double)&local_d58;
      local_d18 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)local_ce0;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)local_d28,
                 (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                  *)&local_ed8);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_ce0);
    }
  }
  std::
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~_Vector_base(&local_e70);
  std::
  _Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~_Vector_base(&local_e90);
  return __return_storage_ptr__;
}

Assistant:

transformations_t upnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 2 );
    
  Eigen::Matrix<double,3,3> F = Eigen::Matrix3d::Zero();
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    F += f * f.transpose();
  }
  
  Eigen::Matrix<double,3,3> H_inv = (indices.size() * Eigen::Matrix<double,3,3>::Identity()) - F;
  Eigen::Matrix<double,3,3> H = H_inv.inverse();
  
  Eigen::Matrix<double,3,10> I = Eigen::Matrix<double,3,10>::Zero();
  Eigen::Matrix<double,3,1> J = Eigen::Matrix<double,3,1>::Zero();
  Eigen::Matrix<double,3,10> Phi;
  
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    
    fill3x10(p,Phi);
    I += Vk * Phi;
    J += Vk * v;
  }
  
  Eigen::Matrix<double,10,10> M = Eigen::Matrix<double,10,10>::Zero();
  Eigen::Matrix<double,1,10>  C = Eigen::Matrix<double,1,10>::Zero();
  double gamma = 0.0;
  
  for(int i = 0; i < (int) indices.size(); i++ )
  {    
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    
    fill3x10(p,Phi);
    Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
    Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I);
    Eigen::Matrix<double,3, 1> bi = -temp * (  v + J);
    
    M     += (Ai.transpose() * Ai);
    C     += (bi.transpose() * Ai);
    gamma += (bi.transpose() * bi);
  }
  
  //now do the main computation
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions1;
  if( indices.size() > 4 )
    modules::upnp_main_sym( M, C, gamma, quaternions1 );
  else
    modules::upnp_main( M, C, gamma, quaternions1 );
  
  //prepare the output vector
  transformations_t transformations;
  
  //Round 1: chirality check
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions2;
  for( int i = 0; i < quaternions1.size(); i++ )
  {
    rotation_t Rinv = math::quaternion2rot(quaternions1[i].second);
    
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s( quaternions1[i].second, s );
    translation_t tinv = I*s - J;
    
    if( transformations.size() == 0 )
    {
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
    
    int count_negative = 0;
    
    for( int j = 0; j < (int) indices.size(); j++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[j]) * adapter.getBearingVector(indices[j]);
      Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[j]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[j]);
      
      Eigen::Vector3d p_est = Rinv*p + tinv - v;
      
      if( p_est.transpose()*f < 0.0 )
        count_negative++;
    }
    
    if( count_negative < floor(0.2 * indices.size() + 0.5) )
      quaternions2.push_back(quaternions1[i]);
  }
  
  if( quaternions2.size() == 0 )
    return transformations;
  else
    transformations.clear();
  
  //Round 2: Second order optimality (plus polishing)
  Eigen::Matrix<double,3,10> I_cay;
  Eigen::Matrix<double,10,10> M_cay;
  Eigen::Matrix<double,1,10>  C_cay;
  double gamma_cay;
  
  for( size_t q = 0; q < quaternions2.size(); q++ )
  {    
    I_cay = Eigen::Matrix<double,3,10>::Zero();
    rotation_t Rinv = math::quaternion2rot(quaternions2[q].second);
    
    for( int i = 0; i < (int) indices.size(); i++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      I_cay += Vk * Phi;
    }
    
    M_cay = Eigen::Matrix<double,10,10>::Zero();
    C_cay = Eigen::Matrix<double,1,10>::Zero();
    gamma_cay = 0.0;
    
    for(int i = 0; i < (int) indices.size(); i++ )
    {    
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
      Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I_cay);
      Eigen::Matrix<double,3,1> bi = -temp * (  v + J);
      
      M_cay     += (Ai.transpose() * Ai);
      C_cay     += (bi.transpose() * Ai);
      gamma_cay += (bi.transpose() * bi);
    }
    
    //now analyze the eigenvalues of the "Hessian"
    Eigen::Vector3d val;
    Eigen::Matrix3d Jacobian;
    f( M_cay, C_cay, gamma_cay, val );
    Jac( M_cay, C_cay, gamma_cay, Jacobian );
    std::vector<double> characteristicPolynomial;
    characteristicPolynomial.push_back(-1.0);
    characteristicPolynomial.push_back(Jacobian(2,2)+Jacobian(1,1)+Jacobian(0,0));
    characteristicPolynomial.push_back(-Jacobian(2,2)*Jacobian(1,1)-Jacobian(2,2)*Jacobian(0,0)-Jacobian(1,1)*Jacobian(0,0)+pow(Jacobian(1,2),2)+pow(Jacobian(0,2),2)+pow(Jacobian(0,1),2));
    characteristicPolynomial.push_back(Jacobian(2,2)*Jacobian(1,1)*Jacobian(0,0)+2*Jacobian(1,2)*Jacobian(0,2)*Jacobian(0,1)-Jacobian(2,2)*pow(Jacobian(0,1),2)-pow(Jacobian(1,2),2)*Jacobian(0,0)-Jacobian(1,1)*pow(Jacobian(0,2),2));
    std::vector<double> roots = opengv::math::o3_roots( characteristicPolynomial );
    
    bool allPositive = true;
    for( size_t i = 0; i < roots.size(); i++ )
    {
      if( roots[i] < 0.0 )
      {
        allPositive = false;
        break;
      }
    }
    
    if( true )//allPositive)//use all results for the moment
    {
      //perform the polishing step
      Eigen::Vector3d cay = - Jacobian.inverse() * val;
      rotation_t Rinv2 = math::cayley2rot(cay) * Rinv;
      quaternion_t q = math::rot2quaternion(Rinv2);
      
      Eigen::Matrix<double,10,1> s;
      modules::upnp_fill_s(q,s);
      translation_t tinv = I*s - J;
      
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv2.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
  }
  
  //if there are no results, simply add the one with lowest score
  if( transformations.size() == 0 )
  {
    Eigen::Vector4d q = quaternions2[0].second;
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s(q,s);
    translation_t tinv = I*s - J;
    rotation_t Rinv = math::quaternion2rot(q);
    
    transformation_t newTransformation;
    newTransformation.block<3,3>(0,0) = Rinv.transpose();
    newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
    transformations.push_back(newTransformation);
  }
  
  return transformations;
}